

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::fillWithRandomColorTiles
               (PixelBufferAccess *dst,Vec4 *minVal,Vec4 *maxVal,deUint32 seed)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int y;
  int z;
  int iVar12;
  int i;
  long lVar13;
  float fVar14;
  Vec4 color;
  Random rnd;
  PixelBufferAccess local_58;
  
  iVar3 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  iVar4 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  iVar12 = 7;
  if (iVar3 < 7) {
    iVar12 = iVar3;
  }
  iVar7 = 5;
  if (iVar4 < 5) {
    iVar7 = iVar4;
  }
  deRandom_init(&rnd.m_rnd,seed);
  iVar8 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
  if (0 < iVar8) {
    z = 0;
    do {
      if (0 < iVar4) {
        iVar8 = 0;
        do {
          iVar10 = iVar8 + 1;
          if (0 < iVar3) {
            iVar11 = 0;
            do {
              iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
              iVar6 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
              iVar9 = iVar5 * iVar11;
              iVar11 = iVar11 + 1;
              color.m_data[0] = 0.0;
              color.m_data[1] = 0.0;
              color.m_data[2] = 0.0;
              color.m_data[3] = 0.0;
              lVar13 = 0;
              do {
                fVar1 = minVal->m_data[lVar13];
                fVar2 = maxVal->m_data[lVar13];
                fVar14 = deRandom_getFloat(&rnd.m_rnd);
                color.m_data[lVar13] = fVar14 * (fVar2 - fVar1) + fVar1;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 4);
              y = (iVar6 * iVar8) / iVar7;
              iVar9 = iVar9 / iVar12;
              tcu::getSubregion(&local_58,dst,iVar9,y,z,(iVar5 * iVar11) / iVar12 - iVar9,
                                (iVar6 * iVar10) / iVar7 - y,1);
              tcu::clear(&local_58,&color);
            } while (iVar11 != iVar12);
          }
          iVar8 = iVar10;
        } while (iVar10 != iVar7);
        iVar8 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
      }
      z = z + 1;
    } while (z < iVar8);
  }
  return;
}

Assistant:

static void fillWithRandomColorTiles (const PixelBufferAccess& dst, const Vec4& minVal, const Vec4& maxVal, deUint32 seed)
{
	const int	numCols		= dst.getWidth()  >= 7 ? 7 : dst.getWidth();
	const int	numRows		= dst.getHeight() >= 5 ? 5 : dst.getHeight();
	de::Random	rnd			(seed);

	for (int slice = 0; slice < dst.getDepth(); slice++)
	for (int row = 0; row < numRows; row++)
	for (int col = 0; col < numCols; col++)
	{
		const int	yBegin	= (row+0)*dst.getHeight()/numRows;
		const int	yEnd	= (row+1)*dst.getHeight()/numRows;
		const int	xBegin	= (col+0)*dst.getWidth()/numCols;
		const int	xEnd	= (col+1)*dst.getWidth()/numCols;
		Vec4		color;
		for (int i = 0; i < 4; i++)
			color[i] = rnd.getFloat(minVal[i], maxVal[i]);
		tcu::clear(tcu::getSubregion(dst, xBegin, yBegin, slice, xEnd-xBegin, yEnd-yBegin, 1), color);
	}
}